

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stealth_strategy.cpp
# Opt level: O0

void __thiscall
StealthStrategy::generateActions(StealthStrategy *this,PlayerSight *sight,Actions *actions)

{
  int iVar1;
  Vec2 pos;
  Vec2 VVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  reference pPVar6;
  Randomizer *this_00;
  Router *this_01;
  float fVar7;
  float fVar8;
  Vec2 local_e8;
  Vec2 local_e0;
  Vec2 local_d8;
  Vec2 local_d0;
  Vec2 local_c8;
  Vec2 local_c0;
  Vec2 local_b8;
  Vec2 local_b0;
  Vec2 local_a8;
  Vec2 local_a0;
  undefined1 auStack_98 [8];
  PUnitInfo uinfo;
  __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_> local_78
  ;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PUnitInfo,_std::allocator<PUnitInfo>_> *__range2;
  Vec2 VStack_58;
  bool found;
  Vec2 local_50;
  undefined1 auStack_48 [8];
  PUnitInfo choice;
  PUnitInfo nearest;
  Actions *actions_local;
  PlayerSight *sight_local;
  StealthStrategy *this_local;
  
  if ((this->field_0xc & 1) == 0) {
    nearest.velocity = (Vec2)actions;
    if (((sight->hp <= this->hp_lower_bound) && ((sight->canSuckAttack & 1U) != 0)) &&
       (0 < sight->unitInSightCount)) {
      PUnitInfo::PUnitInfo((PUnitInfo *)&choice.velocity);
      PUnitInfo::PUnitInfo((PUnitInfo *)auStack_48);
      Vec2::Vec2(&local_50,1e+08,1e+08);
      choice.velocity.y = local_50.x;
      nearest.id = (int)local_50.y;
      Vec2::Vec2(&stack0xffffffffffffffa8,1e+08,1e+08);
      nearest.pos.x = VStack_58.x;
      nearest.pos.y = VStack_58.y;
      bVar4 = false;
      __end2 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::begin(&sight->unitInSight);
      local_78._M_current =
           (PUnitInfo *)std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::end(&sight->unitInSight)
      ;
      while (bVar3 = __gnu_cxx::operator!=(&__end2,&local_78), VVar2 = nearest.velocity, bVar3) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                 ::operator*(&__end2);
        uinfo.pos.y = (pPVar6->velocity).y;
        auStack_98._0_4_ = pPVar6->id;
        auStack_98._4_4_ = (pPVar6->pos).x;
        uinfo._0_8_ = *(undefined8 *)&(pPVar6->pos).y;
        local_a0 = Vec2::operator-((Vec2 *)&choice.velocity.y,&sight->pos);
        fVar7 = Vec2::len2(&local_a0);
        local_a8 = Vec2::operator-((Vec2 *)(auStack_98 + 4),&sight->pos);
        fVar8 = Vec2::len2(&local_a8);
        if (fVar8 < fVar7) {
          choice.velocity.x = auStack_98._0_4_;
          choice.velocity.y = auStack_98._4_4_;
          nearest.id = uinfo.id;
          nearest.pos.x = uinfo.pos.x;
          nearest.pos.y = uinfo.pos.y;
        }
        local_b0 = Vec2::operator-((Vec2 *)(auStack_98 + 4),&sight->pos);
        fVar7 = Vec2::length(&local_b0);
        if (fVar7 <= 4.0) {
          if (bVar4) {
            local_b8 = Vec2::operator-((Vec2 *)(auStack_48 + 4),&sight->pos);
            fVar7 = Vec2::len2(&local_b8);
            local_c0 = Vec2::operator-((Vec2 *)(auStack_98 + 4),&sight->pos);
            fVar8 = Vec2::len2(&local_c0);
            if (fVar7 < fVar8) {
              auStack_48._0_4_ = auStack_98._0_4_;
              auStack_48._4_4_ = auStack_98._4_4_;
              choice.id = uinfo.id;
              choice.pos.x = uinfo.pos.x;
              choice.pos.y = uinfo.pos.y;
            }
          }
          else {
            bVar4 = true;
            auStack_48._0_4_ = auStack_98._0_4_;
            auStack_48._4_4_ = auStack_98._4_4_;
            choice.id = uinfo.id;
            choice.pos.x = uinfo.pos.x;
            choice.pos.y = uinfo.pos.y;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>::
        operator++(&__end2);
      }
      if (sight->unitInSightCount != 0) {
        if (!bVar4) {
          iVar1 = sight->id;
          local_c8 = Vec2::operator+((Vec2 *)&choice.velocity.y,&nearest.pos);
          Actions::emplace((Actions *)VVar2,SelectDestination,iVar1,local_c8);
          return;
        }
        local_d0.y = (float)choice.id;
        local_d0.x = (float)auStack_48._4_4_;
        Actions::emplace((Actions *)nearest.velocity,SuckAttack,auStack_48._0_4_,local_d0);
        VVar2 = nearest.velocity;
        iVar1 = sight->id;
        local_e0 = Vec2::operator*(&choice.pos,10.0);
        local_d8 = Vec2::operator-(&sight->pos,&local_e0);
        Actions::emplace((Actions *)VVar2,SelectDestination,iVar1,local_d8);
        return;
      }
    }
    Vec2::Vec2(&local_e8,0.0,0.0);
    bVar4 = Vec2::operator==(&sight->velocity,&local_e8);
    VVar2 = nearest.velocity;
    if (bVar4) {
      if (this->status == ssWalking) {
        this->status = ssStandby;
        iVar1 = sight->round;
        this_00 = Randomizer::getInstance();
        iVar5 = Randomizer::randWaitTime(this_00);
        this->activeRound = iVar1 + iVar5;
      }
      else if ((this->status == ssStandby) && (this->activeRound <= sight->round)) {
        this->status = ssWalking;
        this->activeRound = 0;
        iVar1 = sight->id;
        this_01 = Router::getInstance();
        pos = Router::availablePosition(this_01);
        Actions::emplace((Actions *)VVar2,SelectDestination,iVar1,pos);
      }
    }
  }
  return;
}

Assistant:

void StealthStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.hp <= hp_lower_bound && sight.canSuckAttack && sight.unitInSightCount > 0)
    {
        PUnitInfo nearest, choice;
        nearest.pos = Vec2(FINF, FINF);
        nearest.velocity = Vec2(FINF, FINF);
        bool found = false;
        for (auto uinfo : sight.unitInSight) {
            if ((nearest.pos - sight.pos).len2() > (uinfo.pos - sight.pos).len2())
                nearest = uinfo;
            if ((uinfo.pos - sight.pos).length() <= SuckRange) {
                if (!found) {
                    found = true;
                    choice = uinfo;
                } else if ((choice.pos - sight.pos).len2() < (uinfo.pos - sight.pos).len2())
                    choice = uinfo;
            }
        }

        if (sight.unitInSightCount != 0)
        {
            if (!found)
                actions->emplace(SelectDestination, sight.id, nearest.pos + nearest.velocity);
            else
            {
                actions->emplace(SuckAttack, choice.id, choice.pos);
                actions->emplace(SelectDestination, sight.id, sight.pos - (choice.velocity * 10.));
            }
            return;
        }
    }
    if (sight.velocity == Vec2())
    {
        if (status == ssWalking)    //开始等待
        {
            status = ssStandby;
            activeRound = sight.round + Randomizer::getInstance()->randWaitTime();
        }
        else if (status == ssStandby && sight.round >= activeRound)
        {
            status = ssWalking;
            activeRound = 0;
            actions->emplace(SelectDestination, sight.id, Router::getInstance()->availablePosition());
        }
    }
}